

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

vector<kiste::line_t,_std::allocator<kiste::line_t>_> *
kiste::parse(vector<kiste::line_t,_std::allocator<kiste::line_t>_> *__return_storage_ptr__,
            parse_context *ctx)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference this;
  reference pvVar4;
  parse_error *this_00;
  value_type *previous_line;
  value_type *line;
  undefined1 local_d0 [8];
  line_data_t line_data;
  parse_context *ctx_local;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> *lines;
  
  memset(__return_storage_ptr__,0,0x18);
  std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::vector(__return_storage_ptr__);
  while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
    ctx->_line_no = ctx->_line_no + 1;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(ctx->_is,(string *)&ctx->_line);
    parse_line((line_data_t *)local_d0,ctx);
    parse_context::update(ctx,(line_data_t *)local_d0);
    line_t::line_t((line_t *)&line,ctx,(line_data_t *)local_d0);
    std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::push_back
              (__return_storage_ptr__,(value_type *)&line);
    line_t::~line_t((line_t *)&line);
    sVar3 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::size(__return_storage_ptr__)
    ;
    if (2 < sVar3) {
      sVar3 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::size
                        (__return_storage_ptr__);
      pvVar4 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::at
                         (__return_storage_ptr__,sVar3 - 1);
      sVar3 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::size
                        (__return_storage_ptr__);
      this = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::at
                       (__return_storage_ptr__,sVar3 - 2);
      bVar2 = line_t::ends_with_text(this);
      pvVar4->_previous_line_ends_with_text = bVar2;
      bVar2 = line_t::starts_with_text(pvVar4);
      this->_next_line_starts_with_text = bVar2;
    }
    line_data_t::~line_data_t((line_data_t *)local_d0);
  }
  bVar2 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::empty(__return_storage_ptr__);
  if ((!bVar2) &&
     (pvVar4 = std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::back
                         (__return_storage_ptr__), pvVar4->_curly_level != 0)) {
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this_00,"not enough closing curly braces");
    __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse(parse_context& ctx) -> std::vector<line_t>
  {
    auto lines = std::vector<line_t>{};

    while (ctx._is.good())
    {
      ++ctx._line_no;
      getline(ctx._is, ctx._line);

      const auto line_data = parse_line(ctx);
      ctx.update(line_data);
      lines.push_back({ctx, line_data});

      if (lines.size() > 2)
      {
        auto& line = lines.at(lines.size() - 1);
        auto& previous_line = lines.at(lines.size() - 2);
        line._previous_line_ends_with_text = previous_line.ends_with_text();
        previous_line._next_line_starts_with_text = line.starts_with_text();
      }
    }
    if (not lines.empty() and lines.back()._curly_level)
    {
      throw parse_error("not enough closing curly braces");
    }

    return lines;
  }